

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportCommand.cxx
# Opt level: O2

bool __thiscall
cmExportCommand::InitialPass
          (cmExportCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  bool bVar1;
  bool bVar2;
  ostream *poVar3;
  string *psVar4;
  cmGlobalGenerator *this_00;
  cmTarget *pcVar5;
  iterator iVar6;
  cmExportSet *pcVar7;
  cmExportBuildFileGenerator *pcVar8;
  _Rb_tree_header *p_Var9;
  string *this_01;
  string *ct;
  cmCommandArgument *this_02;
  pointer pbVar10;
  pointer pbVar11;
  string setName;
  string fname;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  targets;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unknownArgs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configurationTypes;
  string local_50;
  
  this_01 = &setName;
  __lhs = (args->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)__lhs) < 0x21) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configurationTypes,"called with too few arguments",
               (allocator<char> *)&fname);
    cmCommand::SetError(&this->super_cmCommand,(string *)&configurationTypes);
    std::__cxx11::string::~string((string *)&configurationTypes);
    return false;
  }
  bVar1 = std::operator==(__lhs,"PACKAGE");
  if (bVar1) {
    bVar1 = HandlePackage(this,args);
    return bVar1;
  }
  bVar1 = std::operator==((args->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start,"EXPORT");
  this_02 = &(this->ExportSetName).super_cmCommandArgument;
  if (!bVar1) {
    this_02 = &(this->Targets).super_cmCommandArgument;
  }
  cmCommandArgument::Follows(this_02,(cmCommandArgument *)0x0);
  cmCommandArgumentGroup::Follows(&this->ArgumentGroup,this_02);
  unknownArgs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  unknownArgs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  unknownArgs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmCommandArgumentsHelper::Parse(&this->Helper,args,&unknownArgs);
  if (unknownArgs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      unknownArgs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configurationTypes,"Unknown arguments.",(allocator<char> *)&fname);
    cmCommand::SetError(&this->super_cmCommand,(string *)&configurationTypes);
    std::__cxx11::string::~string((string *)&configurationTypes);
    bVar1 = false;
    goto LAB_001707f3;
  }
  fname._M_dataplus._M_p = (pointer)&fname.field_2;
  fname._M_string_length = 0;
  fname.field_2._M_local_buf[0] = '\0';
  bVar1 = (this->AndroidMKFile).super_cmCommandArgument.WasActive;
  if (bVar1 == true) {
    std::__cxx11::string::_M_assign((string *)&fname);
  }
  if ((this->Filename).super_cmCommandArgument.WasActive == false) {
    if (fname._M_string_length != 0) goto LAB_00170417;
    bVar2 = std::operator!=((args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start,"EXPORT");
    if (!bVar2) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &configurationTypes,&(this->ExportSetName).String,".cmake");
      std::__cxx11::string::operator=((string *)&fname,(string *)&configurationTypes);
      std::__cxx11::string::~string((string *)&configurationTypes);
      goto LAB_00170417;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configurationTypes,"FILE <filename> option missing.",
               (allocator<char> *)&setName);
    cmCommand::SetError(&this->super_cmCommand,(string *)&configurationTypes);
    std::__cxx11::string::~string((string *)&configurationTypes);
LAB_001704ac:
    bVar1 = false;
  }
  else {
    if (fname._M_string_length == 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&setName,(this->Filename).String._M_dataplus._M_p,
                 (allocator<char> *)&local_208);
      cmsys::SystemTools::GetFilenameLastExtension((string *)&configurationTypes,&setName);
      bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &configurationTypes,".cmake");
      std::__cxx11::string::~string((string *)&configurationTypes);
      std::__cxx11::string::~string((string *)&setName);
      if (!bVar2) {
        std::__cxx11::string::_M_assign((string *)&fname);
        goto LAB_00170417;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&configurationTypes);
      poVar3 = std::operator<<((ostream *)&configurationTypes,"FILE option given filename \"");
      poVar3 = std::operator<<(poVar3,(string *)&(this->Filename).String);
      std::operator<<(poVar3,"\" which does not have an extension of \".cmake\".\n");
      std::__cxx11::stringbuf::str();
      cmCommand::SetError(&this->super_cmCommand,&setName);
LAB_00170497:
      std::__cxx11::string::~string((string *)&setName);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&configurationTypes);
      goto LAB_001704ac;
    }
LAB_00170417:
    bVar2 = cmsys::SystemTools::FileIsFullPath(&fname);
    if (bVar2) {
      bVar2 = cmMakefile::CanIWriteThisFile((this->super_cmCommand).Makefile,&fname);
      if (!bVar2) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&configurationTypes);
        poVar3 = std::operator<<((ostream *)&configurationTypes,"FILE option given filename \"");
        poVar3 = std::operator<<(poVar3,(string *)&fname);
        std::operator<<(poVar3,"\" which is in the source tree.\n");
        std::__cxx11::stringbuf::str();
        cmCommand::SetError(&this->super_cmCommand,&setName);
        goto LAB_00170497;
      }
    }
    else {
      psVar4 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_((this->super_cmCommand).Makefile);
      std::__cxx11::string::string((string *)&configurationTypes,(string *)psVar4);
      std::operator+(&local_208,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &configurationTypes,"/");
      std::operator+(&setName,&local_208,&fname);
      std::__cxx11::string::operator=((string *)&fname,(string *)&setName);
      std::__cxx11::string::~string((string *)&setName);
      std::__cxx11::string::~string((string *)&local_208);
      std::__cxx11::string::~string((string *)&configurationTypes);
    }
    targets.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    targets.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    targets.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    this_00 = cmMakefile::GetGlobalGenerator((this->super_cmCommand).Makefile);
    bVar2 = std::operator==((args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start,"EXPORT");
    if (bVar2) {
      if ((this->Append).Enabled == true) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&configurationTypes);
        std::operator<<((ostream *)&configurationTypes,
                        "EXPORT signature does not recognise the APPEND option.");
        std::__cxx11::stringbuf::str();
        cmCommand::SetError(&this->super_cmCommand,&setName);
      }
      else {
        if ((this->ExportOld).Enabled != true) {
          std::__cxx11::string::string((string *)&setName,(string *)&(this->ExportSetName).String);
          iVar6 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet_*>_>_>
                  ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet_*>_>_>
                          *)&this_00->ExportSets,&setName);
          p_Var9 = &(this_00->ExportSets).
                    super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet_*>_>_>
                    ._M_t._M_impl.super__Rb_tree_header;
          if ((_Rb_tree_header *)iVar6._M_node == p_Var9) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&configurationTypes);
            poVar3 = std::operator<<((ostream *)&configurationTypes,"Export set \"");
            poVar3 = std::operator<<(poVar3,(string *)&setName);
            std::operator<<(poVar3,"\" not found.");
            std::__cxx11::stringbuf::str();
            cmCommand::SetError(&this->super_cmCommand,&local_208);
            std::__cxx11::string::~string((string *)&local_208);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&configurationTypes);
          }
          else {
            pcVar7 = cmExportSetMap::operator[](&this_00->ExportSets,&setName);
            this->ExportSet = pcVar7;
          }
          std::__cxx11::string::~string((string *)&setName);
          if ((_Rb_tree_header *)iVar6._M_node != p_Var9) goto LAB_001708e4;
          goto LAB_001707dd;
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&configurationTypes);
        std::operator<<((ostream *)&configurationTypes,
                        "EXPORT signature does not recognise the EXPORT_LINK_INTERFACE_LIBRARIES option."
                       );
        std::__cxx11::stringbuf::str();
        cmCommand::SetError(&this->super_cmCommand,&setName);
      }
LAB_001707c8:
      std::__cxx11::string::~string((string *)&setName);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&configurationTypes);
LAB_001707dd:
      bVar1 = false;
    }
    else {
      if ((this->Targets).super_cmCommandArgument.WasActive != true) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&configurationTypes,"EXPORT or TARGETS specifier missing.",
                   (allocator<char> *)&setName);
        cmCommand::SetError(&this->super_cmCommand,(string *)&configurationTypes);
        this_01 = (string *)&configurationTypes;
LAB_0017068b:
        std::__cxx11::string::~string((string *)this_01);
        goto LAB_001707dd;
      }
      pbVar11 = (this->Targets).Vector.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      for (pbVar10 = (this->Targets).Vector.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; pbVar10 != pbVar11;
          pbVar10 = pbVar10 + 1) {
        bVar2 = cmMakefile::IsAlias((this->super_cmCommand).Makefile,pbVar10);
        if (bVar2) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&configurationTypes);
          poVar3 = std::operator<<((ostream *)&configurationTypes,"given ALIAS target \"");
          poVar3 = std::operator<<(poVar3,(string *)pbVar10);
          std::operator<<(poVar3,"\" which may not be exported.");
          std::__cxx11::stringbuf::str();
          cmCommand::SetError(&this->super_cmCommand,&setName);
          goto LAB_001707c8;
        }
        pcVar5 = cmGlobalGenerator::FindTarget(this_00,pbVar10,false);
        if (pcVar5 == (cmTarget *)0x0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&configurationTypes);
          poVar3 = std::operator<<((ostream *)&configurationTypes,"given target \"");
          poVar3 = std::operator<<(poVar3,(string *)pbVar10);
          std::operator<<(poVar3,"\" which is not built by this project.");
          std::__cxx11::stringbuf::str();
          cmCommand::SetError(&this->super_cmCommand,&setName);
          goto LAB_001707c8;
        }
        if (pcVar5->TargetTypeValue == UTILITY) {
          std::operator+(&setName,"given custom target \"",pbVar10);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &configurationTypes,&setName,"\" which may not be exported.");
          cmCommand::SetError(&this->super_cmCommand,(string *)&configurationTypes);
          std::__cxx11::string::~string((string *)&configurationTypes);
          goto LAB_0017068b;
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&targets,pbVar10);
      }
      if (((this->Append).Enabled == true) &&
         (pcVar8 = cmGlobalGenerator::GetExportedTargetsFile(this_00,&fname),
         pcVar8 != (cmExportBuildFileGenerator *)0x0)) {
        bVar1 = true;
        cmExportBuildFileGenerator::AppendTargets(pcVar8,&targets);
      }
      else {
LAB_001708e4:
        if (bVar1 == false) {
          pcVar8 = (cmExportBuildFileGenerator *)operator_new(0x140);
          cmExportBuildFileGenerator::cmExportBuildFileGenerator(pcVar8);
        }
        else {
          pcVar8 = (cmExportBuildFileGenerator *)operator_new(0x140);
          cmExportBuildAndroidMKGenerator::cmExportBuildAndroidMKGenerator
                    ((cmExportBuildAndroidMKGenerator *)pcVar8);
        }
        cmExportFileGenerator::SetExportFile
                  (&pcVar8->super_cmExportFileGenerator,fname._M_dataplus._M_p);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&configurationTypes,(this->Namespace).String._M_dataplus._M_p,
                   (allocator<char> *)&setName);
        std::__cxx11::string::_M_assign((string *)&(pcVar8->super_cmExportFileGenerator).Namespace);
        std::__cxx11::string::~string((string *)&configurationTypes);
        (pcVar8->super_cmExportFileGenerator).AppendMode = (this->Append).Enabled;
        if (this->ExportSet == (cmExportSet *)0x0) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator=(&pcVar8->Targets,&targets);
        }
        else {
          cmExportBuildFileGenerator::SetExportSet(pcVar8,this->ExportSet);
        }
        cmMakefile::AddExportBuildFileGenerator((this->super_cmCommand).Makefile,pcVar8);
        (pcVar8->super_cmExportFileGenerator).ExportOld = (this->ExportOld).Enabled;
        configurationTypes.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        configurationTypes.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        configurationTypes.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        cmMakefile::GetConfigurations
                  (&local_50,(this->super_cmCommand).Makefile,&configurationTypes,true);
        std::__cxx11::string::~string((string *)&local_50);
        pbVar10 = configurationTypes.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pbVar11 = configurationTypes.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        if (configurationTypes.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            configurationTypes.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::emplace_back<>(&configurationTypes);
          pbVar10 = configurationTypes.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pbVar11 = configurationTypes.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        }
        for (; pbVar10 != pbVar11; pbVar10 = pbVar10 + 1) {
          cmExportFileGenerator::AddConfiguration(&pcVar8->super_cmExportFileGenerator,pbVar10);
        }
        if (this->ExportSet == (cmExportSet *)0x0) {
          cmGlobalGenerator::AddBuildExportSet(this_00,pcVar8);
        }
        else {
          cmGlobalGenerator::AddBuildExportExportSet(this_00,pcVar8);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&configurationTypes);
        bVar1 = true;
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&targets);
  }
  std::__cxx11::string::~string((string *)&fname);
LAB_001707f3:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&unknownArgs);
  return bVar1;
}

Assistant:

bool cmExportCommand::InitialPass(std::vector<std::string> const& args,
                                  cmExecutionStatus&)
{
  if (args.size() < 2) {
    this->SetError("called with too few arguments");
    return false;
  }

  if (args[0] == "PACKAGE") {
    return this->HandlePackage(args);
  }
  if (args[0] == "EXPORT") {
    this->ExportSetName.Follows(nullptr);
    this->ArgumentGroup.Follows(&this->ExportSetName);
  } else {
    this->Targets.Follows(nullptr);
    this->ArgumentGroup.Follows(&this->Targets);
  }

  std::vector<std::string> unknownArgs;
  this->Helper.Parse(&args, &unknownArgs);

  if (!unknownArgs.empty()) {
    this->SetError("Unknown arguments.");
    return false;
  }

  std::string fname;
  bool android = false;
  if (this->AndroidMKFile.WasFound()) {
    fname = this->AndroidMKFile.GetString();
    android = true;
  }
  if (!this->Filename.WasFound() && fname.empty()) {
    if (args[0] != "EXPORT") {
      this->SetError("FILE <filename> option missing.");
      return false;
    }
    fname = this->ExportSetName.GetString() + ".cmake";
  } else if (fname.empty()) {
    // Make sure the file has a .cmake extension.
    if (cmSystemTools::GetFilenameLastExtension(this->Filename.GetCString()) !=
        ".cmake") {
      std::ostringstream e;
      e << "FILE option given filename \"" << this->Filename.GetString()
        << "\" which does not have an extension of \".cmake\".\n";
      this->SetError(e.str());
      return false;
    }
    fname = this->Filename.GetString();
  }

  // Get the file to write.
  if (cmSystemTools::FileIsFullPath(fname)) {
    if (!this->Makefile->CanIWriteThisFile(fname)) {
      std::ostringstream e;
      e << "FILE option given filename \"" << fname
        << "\" which is in the source tree.\n";
      this->SetError(e.str());
      return false;
    }
  } else {
    // Interpret relative paths with respect to the current build dir.
    std::string dir = this->Makefile->GetCurrentBinaryDirectory();
    fname = dir + "/" + fname;
  }

  std::vector<std::string> targets;

  cmGlobalGenerator* gg = this->Makefile->GetGlobalGenerator();

  if (args[0] == "EXPORT") {
    if (this->Append.IsEnabled()) {
      std::ostringstream e;
      e << "EXPORT signature does not recognise the APPEND option.";
      this->SetError(e.str());
      return false;
    }

    if (this->ExportOld.IsEnabled()) {
      std::ostringstream e;
      e << "EXPORT signature does not recognise the "
           "EXPORT_LINK_INTERFACE_LIBRARIES option.";
      this->SetError(e.str());
      return false;
    }

    cmExportSetMap& setMap = gg->GetExportSets();
    std::string setName = this->ExportSetName.GetString();
    if (setMap.find(setName) == setMap.end()) {
      std::ostringstream e;
      e << "Export set \"" << setName << "\" not found.";
      this->SetError(e.str());
      return false;
    }
    this->ExportSet = setMap[setName];
  } else if (this->Targets.WasFound()) {
    for (std::string const& currentTarget : this->Targets.GetVector()) {
      if (this->Makefile->IsAlias(currentTarget)) {
        std::ostringstream e;
        e << "given ALIAS target \"" << currentTarget
          << "\" which may not be exported.";
        this->SetError(e.str());
        return false;
      }

      if (cmTarget* target = gg->FindTarget(currentTarget)) {
        if (target->GetType() == cmStateEnums::UTILITY) {
          this->SetError("given custom target \"" + currentTarget +
                         "\" which may not be exported.");
          return false;
        }
      } else {
        std::ostringstream e;
        e << "given target \"" << currentTarget
          << "\" which is not built by this project.";
        this->SetError(e.str());
        return false;
      }
      targets.push_back(currentTarget);
    }
    if (this->Append.IsEnabled()) {
      if (cmExportBuildFileGenerator* ebfg =
            gg->GetExportedTargetsFile(fname)) {
        ebfg->AppendTargets(targets);
        return true;
      }
    }
  } else {
    this->SetError("EXPORT or TARGETS specifier missing.");
    return false;
  }

  // Setup export file generation.
  cmExportBuildFileGenerator* ebfg = nullptr;
  if (android) {
    ebfg = new cmExportBuildAndroidMKGenerator;
  } else {
    ebfg = new cmExportBuildFileGenerator;
  }
  ebfg->SetExportFile(fname.c_str());
  ebfg->SetNamespace(this->Namespace.GetCString());
  ebfg->SetAppendMode(this->Append.IsEnabled());
  if (this->ExportSet) {
    ebfg->SetExportSet(this->ExportSet);
  } else {
    ebfg->SetTargets(targets);
  }
  this->Makefile->AddExportBuildFileGenerator(ebfg);
  ebfg->SetExportOld(this->ExportOld.IsEnabled());

  // Compute the set of configurations exported.
  std::vector<std::string> configurationTypes;
  this->Makefile->GetConfigurations(configurationTypes);
  if (configurationTypes.empty()) {
    configurationTypes.emplace_back();
  }
  for (std::string const& ct : configurationTypes) {
    ebfg->AddConfiguration(ct);
  }
  if (this->ExportSet) {
    gg->AddBuildExportExportSet(ebfg);
  } else {
    gg->AddBuildExportSet(ebfg);
  }

  return true;
}